

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeDatePrototype
               (DynamicObject *datePrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar3;
  JavascriptMethod p_Var1;
  RuntimeFunction *pRVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,datePrototype,mode,0x30,0);
  this = (((datePrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (datePrototype,0x67,(this->super_JavascriptLibraryBase).dateConstructor.ptr,6,0,0,uVar4)
  ;
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetDate);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetDate,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x9c);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x9c,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetDay);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetDay,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x9d);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x9d,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetFullYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetFullYear,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x9e);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x9e,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetHours);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetHours,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x9f);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x9f,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetMilliseconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetMilliseconds,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xa0);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xa0,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetMinutes);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetMinutes,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xa1);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xa1,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetMonth);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetMonth,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xa2);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xa2,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetSeconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetSeconds,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xa8);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xa8,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetTime);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetTime,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0xa9);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xa9,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetTimezoneOffset);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetTimezoneOffset,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xaa);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xaa,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDate);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDate,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xab);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xab,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDay)
  ;
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCDay,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xac);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xac,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCFullYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCFullYear,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xad);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xad,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCHours);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCHours,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xae);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xae,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMilliseconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMilliseconds,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xaf);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xaf,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMinutes);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMinutes,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xb0);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xb0,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMonth);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCMonth,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xb1);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xb1,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::GetUTCSeconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetUTCSeconds,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xb2);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xb2,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::GetYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::GetYear,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0xb3);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0xb3,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetDate);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetDate,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x13e);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x13e,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetFullYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetFullYear,3,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x13f);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x13f,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetHours);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetHours,4,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x140);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x140,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetMilliseconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetMilliseconds,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x141);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x141,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetMinutes);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetMinutes,3,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x142);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x142,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetMonth);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetMonth,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x143);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x143,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetSeconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetSeconds,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x144);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x144,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetTime);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetTime,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x145);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x145,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCDate);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCDate,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x146);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x146,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCFullYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCFullYear,3,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x147);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x147,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCHours);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCHours,4,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x148);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x148,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMilliseconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMilliseconds,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x149);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x149,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMinutes);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMinutes,3,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x14a);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x14a,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMonth);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCMonth,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x14b);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x14b,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::SetUTCSeconds);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetUTCSeconds,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x14c);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x14c,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::SetYear);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::SetYear,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x14d);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x14d,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToDateString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToDateString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x16b);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x16b,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToISOString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToISOString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x16e);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x16e,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ToJSON);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToJSON,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x16f);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x16f,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleDateString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleDateString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x170);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x170,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x172);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x172,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleTimeString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToLocaleTimeString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x173);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x173,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ToString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x178,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToTimeString);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToTimeString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x17a);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x17a,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ToUTCString,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x17c);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x17c,pRVar2,6,0,0,uVar4);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)JavascriptDate::EntryInfo::ToUTCString);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x19e,pRVar2,6,0,0,uVar4);
  p_Var1 = FunctionInfo::GetOriginalEntryPoint((FunctionInfo *)JavascriptDate::EntryInfo::ValueOf);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptDate::EntryInfo::ValueOf,0,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x18e);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(datePrototype,0x18e,pRVar2,6,0,0,uVar4);
  ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
  if (((this_00->config).threadConfig)->m_ES6ToPrimitive == true) {
    p_Var1 = FunctionInfo::GetOriginalEntryPoint
                       ((FunctionInfo *)JavascriptDate::EntryInfo::SymbolToPrimitive);
    pRVar2 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptDate::EntryInfo::SymbolToPrimitive,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x2c4);
    (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])
              (datePrototype,0x1a,pRVar2,6,0,0,uVar4 & 0xffffffff00000000);
    ScriptContext::SetBuiltInLibraryFunction(this_00,p_Var1,&pRVar2->super_JavascriptFunction);
    (*(datePrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x3b])(datePrototype,0x1a,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(datePrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDatePrototype(DynamicObject* datePrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(datePrototype, mode, 48);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterDate
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = datePrototype->GetScriptContext();
        JavascriptLibrary* library = datePrototype->GetLibrary();
        library->AddMember(datePrototype, PropertyIds::constructor, library->dateConstructor);
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getDate, &JavascriptDate::EntryInfo::GetDate, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetDay.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getDay, &JavascriptDate::EntryInfo::GetDay, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getFullYear, &JavascriptDate::EntryInfo::GetFullYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getHours, &JavascriptDate::EntryInfo::GetHours, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMilliseconds, &JavascriptDate::EntryInfo::GetMilliseconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMinutes, &JavascriptDate::EntryInfo::GetMinutes, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getMonth, &JavascriptDate::EntryInfo::GetMonth, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getSeconds, &JavascriptDate::EntryInfo::GetSeconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetTime.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getTime, &JavascriptDate::EntryInfo::GetTime, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetTimezoneOffset.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getTimezoneOffset, &JavascriptDate::EntryInfo::GetTimezoneOffset, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCDate, &JavascriptDate::EntryInfo::GetUTCDate, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCDay.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCDay, &JavascriptDate::EntryInfo::GetUTCDay, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCFullYear, &JavascriptDate::EntryInfo::GetUTCFullYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCHours, &JavascriptDate::EntryInfo::GetUTCHours, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMilliseconds, &JavascriptDate::EntryInfo::GetUTCMilliseconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMinutes, &JavascriptDate::EntryInfo::GetUTCMinutes, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCMonth, &JavascriptDate::EntryInfo::GetUTCMonth, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetUTCSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getUTCSeconds, &JavascriptDate::EntryInfo::GetUTCSeconds, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::GetYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::getYear, &JavascriptDate::EntryInfo::GetYear, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setDate, &JavascriptDate::EntryInfo::SetDate, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setFullYear, &JavascriptDate::EntryInfo::SetFullYear, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setHours, &JavascriptDate::EntryInfo::SetHours, 4));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMilliseconds, &JavascriptDate::EntryInfo::SetMilliseconds, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMinutes, &JavascriptDate::EntryInfo::SetMinutes, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setMonth, &JavascriptDate::EntryInfo::SetMonth, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setSeconds, &JavascriptDate::EntryInfo::SetSeconds, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetTime.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setTime, &JavascriptDate::EntryInfo::SetTime, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCDate.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCDate, &JavascriptDate::EntryInfo::SetUTCDate, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCFullYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCFullYear, &JavascriptDate::EntryInfo::SetUTCFullYear, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCHours.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCHours, &JavascriptDate::EntryInfo::SetUTCHours, 4));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMilliseconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMilliseconds, &JavascriptDate::EntryInfo::SetUTCMilliseconds, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMinutes.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMinutes, &JavascriptDate::EntryInfo::SetUTCMinutes, 3));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCMonth.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCMonth, &JavascriptDate::EntryInfo::SetUTCMonth, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetUTCSeconds.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setUTCSeconds, &JavascriptDate::EntryInfo::SetUTCSeconds, 2));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SetYear.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::setYear, &JavascriptDate::EntryInfo::SetYear, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToDateString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toDateString, &JavascriptDate::EntryInfo::ToDateString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToISOString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toISOString, &JavascriptDate::EntryInfo::ToISOString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToJSON.GetOriginalEntryPoint(),
             library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toJSON, &JavascriptDate::EntryInfo::ToJSON, 1));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleDateString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleDateString, &JavascriptDate::EntryInfo::ToLocaleDateString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleString, &JavascriptDate::EntryInfo::ToLocaleString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToLocaleTimeString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toLocaleTimeString, &JavascriptDate::EntryInfo::ToLocaleTimeString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toString, &JavascriptDate::EntryInfo::ToString, 0));
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToTimeString.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toTimeString, &JavascriptDate::EntryInfo::ToTimeString, 0));

        // Spec stipulates toGMTString must be the same function object as toUTCString
        JavascriptFunction *toUTCStringFunc = library->AddFunctionToLibraryObject(datePrototype, PropertyIds::toUTCString, &JavascriptDate::EntryInfo::ToUTCString, 0);
        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ToUTCString.GetOriginalEntryPoint(), toUTCStringFunc);
        library->AddMember(datePrototype, PropertyIds::toGMTString, toUTCStringFunc, PropertyBuiltInMethodDefaults);

        scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::ValueOf.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(datePrototype, PropertyIds::valueOf, &JavascriptDate::EntryInfo::ValueOf, 0));

        if (scriptContext->GetConfig()->IsES6ToPrimitiveEnabled())
        {
            scriptContext->SetBuiltInLibraryFunction(JavascriptDate::EntryInfo::SymbolToPrimitive.GetOriginalEntryPoint(),
                library->AddFunctionToLibraryObjectWithName(datePrototype, PropertyIds::_symbolToPrimitive, PropertyIds::_RuntimeFunctionNameId_toPrimitive,
                &JavascriptDate::EntryInfo::SymbolToPrimitive, 1));
            datePrototype->SetWritable(PropertyIds::_symbolToPrimitive, false);
        }
        datePrototype->SetHasNoEnumerableProperties(true);

        return true;
    }